

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O2

uint64_t helper_iwmmxt_rorl_arm(CPUARMState *env,uint64_t x,uint32_t n)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar1 = (byte)n;
  uVar5 = (x & 0xffffffff) >> (bVar1 & 0x3f);
  uVar3 = x << (0x20 - bVar1 & 0x3f) & 0xffffffff;
  uVar4 = uVar3 | x >> (bVar1 & 0x3f) & 0xffffffff00000000 | uVar5;
  uVar2 = (x & 0xffffffff00000000) << (0x20 - bVar1 & 0x3f) | uVar4;
  (env->iwmmxt).cregs[3] =
       (uint)(uVar2 >> 0x20 == 0) << 0x1e |
       (uint)((int)uVar4 == 0) << 0xe |
       ((uint)(uVar3 >> 0x10) | (uint)(uVar5 >> 0x10) & 0xffff) & 0x8000 |
       (uint)(uVar2 >> 0x20) & 0x80000000;
  return uVar2;
}

Assistant:

uint64_t HELPER(iwmmxt_rorl)(CPUARMState *env, uint64_t x, uint32_t n)
{
    x = ((x & (0xffffffffll << 0)) >> n) |
        ((x >> n) & (0xffffffffll << 32)) |
        ((x << (32 - n)) & (0xffffffffll << 0)) |
        ((x & (0xffffffffll << 32)) << (32 - n));
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT32(x >> 0, 0) | NZBIT32(x >> 32, 1);
    return x;
}